

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *pOVar1;
  uint uVar2;
  EXRHeader *exr_header;
  long *plVar3;
  pointer pvVar4;
  ulong uVar5;
  char **ppcVar6;
  EXRHeader **ppEVar7;
  bool bVar8;
  int iVar9;
  OffsetData *pOVar10;
  long lVar11;
  char *pcVar12;
  pointer pOVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong *puVar19;
  pointer pOVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  byte bVar24;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  string local_118;
  char **local_f8;
  OffsetData *local_f0;
  OffsetData *local_e8;
  uint local_dc;
  OffsetData *local_d8;
  ulong local_d0;
  pointer local_c8;
  ulong local_c0;
  EXRHeader **local_b8;
  size_t local_b0;
  long local_a8;
  uchar *local_a0;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  EXRImage *local_38;
  
  local_a0 = memory;
  local_38 = exr_images;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Invalid argument for LoadEXRMultipartImageFromMemory()","");
    if (err != (char **)0x0) {
LAB_0010bcbc:
      pcVar12 = strdup(local_118._M_dataplus._M_p);
      *err = pcVar12;
    }
LAB_0010bcc9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    iVar18 = -3;
  }
  else {
    local_d8 = (OffsetData *)(ulong)num_parts;
    pOVar10 = (OffsetData *)0x0;
    lVar17 = 0;
    do {
      local_f8 = err;
      if ((ulong)exr_headers[(long)pOVar10]->header_len == 0) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"EXRHeader variable is not initialized.","");
        err = local_f8;
        if (local_f8 != (char **)0x0) goto LAB_0010bcbc;
        goto LAB_0010bcc9;
      }
      lVar17 = lVar17 + (ulong)exr_headers[(long)pOVar10]->header_len;
      pOVar10 = (OffsetData *)
                ((long)&(pOVar10->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_d8 != pOVar10);
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_dc = num_parts;
    local_b8 = exr_headers;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&local_98,(size_type)local_d8);
    bVar23 = local_dc != 0;
    local_b0 = size;
    if (local_dc == 0) {
      iVar18 = -3;
    }
    else {
      puVar19 = (ulong *)(local_a0 + lVar17 + 9);
      iVar18 = -3;
      pOVar10 = (OffsetData *)0x0;
      do {
        local_f0 = pOVar10;
        std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                  (&local_98,
                   ((long)local_98.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        local_c8 = local_98.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        pOVar10 = local_98.
                  super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1;
        exr_header = local_b8[(long)local_f0];
        if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
          tinyexr::InitSingleResolutionOffsets(pOVar10,(long)exr_header->chunk_count);
          plVar3 = *(long **)&(((pOVar10->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              )._M_impl;
          lVar17 = *plVar3;
          bVar8 = plVar3[1] != lVar17;
          if (bVar8) {
            uVar21 = 0;
            do {
              uVar16 = *puVar19;
              if (uVar16 < size) {
                *(ulong *)(lVar17 + uVar21 * 8) = uVar16 + 4;
                puVar19 = puVar19 + 1;
              }
              else {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_118,"Invalid offset size in EXR header chunks.","");
                ppcVar6 = local_f8;
                if (local_f8 != (char **)0x0) {
                  pcVar12 = strdup(local_118._M_dataplus._M_p);
                  *ppcVar6 = pcVar12;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
                iVar18 = -4;
              }
              size = local_b0;
              if (local_b0 <= uVar16) {
                iVar9 = 1;
                goto LAB_0010bc5b;
              }
              uVar21 = uVar21 + 1;
              lVar17 = *plVar3;
              bVar8 = uVar21 < (ulong)(plVar3[1] - lVar17 >> 3);
            } while (bVar8);
          }
          iVar9 = 0;
LAB_0010bc5b:
          bVar8 = !bVar8;
LAB_0010bc66:
          if (bVar8) {
            iVar9 = 0;
          }
        }
        else {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          bVar8 = tinyexr::PrecalculateTileInfo(&local_58,&local_78,exr_header);
          ppEVar7 = local_b8;
          pOVar1 = local_f0;
          local_e8 = pOVar10;
          if (bVar8) {
            iVar9 = tinyexr::InitTileOffsets(pOVar10,local_b8[(long)local_f0],&local_58,&local_78);
            pOVar10 = local_e8;
            bVar8 = iVar9 == ppEVar7[(long)pOVar1]->chunk_count;
            if (!bVar8) {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_118,"Invalid offset table size.","");
              goto LAB_0010ba33;
            }
          }
          else {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"Invalid tile info.","");
LAB_0010ba33:
            ppcVar6 = local_f8;
            if (local_f8 != (char **)0x0) {
              pcVar12 = strdup(local_118._M_dataplus._M_p);
              *ppcVar6 = pcVar12;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            iVar18 = -4;
            bVar8 = false;
          }
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          iVar9 = 1;
          if (bVar8) {
            if (local_c8[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_c8[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar21 = 0;
              do {
                pvVar4 = (pOVar10->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar9 = 0xe;
                uVar16 = uVar21;
                if (*(pointer *)
                     ((long)&pvVar4[uVar21].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl + 8) !=
                    *(pointer *)
                     &pvVar4[uVar21].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl) {
                  uVar15 = 0;
                  local_d0 = uVar21;
                  do {
                    lVar17 = *(long *)&(pOVar10->offsets).
                                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl;
                    lVar11 = *(long *)(lVar17 + uVar15 * 0x18);
                    iVar9 = 0x11;
                    bVar24 = *(long *)(lVar17 + 8 + uVar15 * 0x18) != lVar11;
                    if ((bool)bVar24) {
                      uVar16 = 0;
                      uVar14 = 1;
                      local_c0 = uVar15;
                      do {
                        uVar5 = *puVar19;
                        if (uVar5 < size) {
                          *(ulong *)(lVar11 + uVar16 * 8) = uVar5 + 4;
                          puVar19 = puVar19 + 1;
                        }
                        else {
                          local_a8 = CONCAT71(local_a8._1_7_,bVar24);
                          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_118,
                                     "Invalid offset size in EXR header chunks.","");
                          ppcVar6 = local_f8;
                          if (local_f8 != (char **)0x0) {
                            pcVar12 = strdup(local_118._M_dataplus._M_p);
                            *ppcVar6 = pcVar12;
                          }
                          size = local_b0;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_118._M_dataplus._M_p != &local_118.field_2) {
                            operator_delete(local_118._M_dataplus._M_p);
                          }
                          iVar18 = -4;
                          bVar24 = (byte)local_a8;
                          pOVar10 = local_e8;
                        }
                        if (size <= uVar5) {
                          iVar9 = 1;
                          uVar15 = local_c0;
                          goto LAB_0010bbd2;
                        }
                        lVar17 = *(long *)&(pOVar10->offsets).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl;
                        lVar11 = *(long *)(lVar17 + uVar15 * 0x18);
                        uVar16 = *(long *)(lVar17 + 8 + uVar15 * 0x18) - lVar11 >> 3;
                        bVar24 = uVar14 < uVar16;
                        bVar8 = uVar14 < uVar16;
                        uVar16 = uVar14;
                        uVar14 = (ulong)((int)uVar14 + 1);
                      } while (bVar8);
                      iVar9 = 0x11;
                      uVar15 = local_c0;
                    }
LAB_0010bbd2:
                    uVar16 = local_d0;
                    if ((bVar24 & 1) != 0) goto LAB_0010bc13;
                    pvVar4 = (pOVar10->offsets).
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar15 = (ulong)((int)uVar15 + 1);
                    uVar14 = ((long)*(pointer *)
                                     ((long)&pvVar4[uVar21].
                                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                             ._M_impl + 8) -
                              *(long *)&pvVar4[uVar21].
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl >> 3) * -0x5555555555555555;
                  } while (uVar15 <= uVar14 && uVar14 - uVar15 != 0);
                  iVar9 = 0xe;
                }
LAB_0010bc13:
                if (iVar9 != 0xe) goto LAB_0010bc63;
                uVar21 = (ulong)((int)uVar16 + 1);
                uVar16 = ((long)local_c8[-1].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c8[-1].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
              } while (uVar21 <= uVar16 && uVar16 - uVar21 != 0);
            }
            iVar9 = 0xb;
LAB_0010bc63:
            bVar8 = iVar9 == 0xb;
            goto LAB_0010bc66;
          }
        }
        if (iVar9 != 0) break;
        pOVar10 = (OffsetData *)
                  ((long)&(local_f0->offsets).
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
        bVar23 = pOVar10 < local_d8;
      } while (pOVar10 != local_d8);
    }
    if (!bVar23) {
      if (local_dc != 0) {
        pOVar10 = (OffsetData *)0x0;
        do {
          pOVar1 = local_98.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)pOVar10;
          bVar24 = local_98.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pOVar10].offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_98.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pOVar10].offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_e8 = pOVar10;
          if ((bool)bVar24) {
            pOVar20 = (pointer)0x0;
            do {
              local_d0 = CONCAT71(local_d0._1_7_,bVar24);
              pvVar4 = (pOVar1->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar24 = *(pointer *)
                        ((long)&pvVar4[(long)pOVar20].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl + 8) !=
                       *(pointer *)
                        &pvVar4[(long)pOVar20].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl;
              local_c8 = pOVar20;
              if ((bool)bVar24) {
                uVar21 = 0;
                do {
                  local_f0 = (OffsetData *)CONCAT71(local_f0._1_7_,bVar24);
                  lVar17 = *(long *)&(pOVar1->offsets).
                                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)pOVar20].
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl;
                  lVar22 = uVar21 * 3;
                  lVar11 = *(long *)(lVar17 + uVar21 * 0x18);
                  bVar23 = *(long *)(lVar17 + 8 + uVar21 * 0x18) != lVar11;
                  local_c0 = uVar21;
                  if (bVar23) {
                    uVar21 = 0;
                    uVar16 = 1;
                    local_a8 = lVar22;
                    do {
                      uVar2 = *(uint *)(local_a0 + *(long *)(lVar11 + uVar21 * 8) + -4);
                      if (pOVar10 != (OffsetData *)(ulong)uVar2) {
                        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,
                                   "Invalid `part number\' in EXR header chunks.","");
                        ppcVar6 = local_f8;
                        if (local_f8 != (char **)0x0) {
                          pcVar12 = strdup(local_118._M_dataplus._M_p);
                          *ppcVar6 = pcVar12;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != &local_118.field_2) {
                          operator_delete(local_118._M_dataplus._M_p);
                        }
                        iVar18 = -4;
                        pOVar10 = local_e8;
                        lVar22 = local_a8;
                      }
                      if (pOVar10 != (OffsetData *)(ulong)uVar2) break;
                      lVar17 = *(long *)&(pOVar1->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[(long)pOVar20].
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl;
                      lVar11 = *(long *)(lVar17 + lVar22 * 8);
                      uVar21 = *(long *)(lVar17 + 8 + lVar22 * 8) - lVar11 >> 3;
                      bVar23 = uVar16 < uVar21;
                      bVar8 = uVar16 < uVar21;
                      uVar21 = uVar16;
                      uVar16 = (ulong)((int)uVar16 + 1);
                    } while (bVar8);
                  }
                  if (bVar23) {
                    bVar24 = (byte)local_f0;
                    break;
                  }
                  uVar21 = (ulong)((int)local_c0 + 1);
                  pvVar4 = (pOVar1->offsets).
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar16 = ((long)*(pointer *)
                                   ((long)&pvVar4[(long)pOVar20].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl + 8) -
                            *(long *)&pvVar4[(long)pOVar20].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl >> 3) * -0x5555555555555555;
                  bVar23 = uVar16 - uVar21 != 0;
                  bVar24 = uVar21 <= uVar16 && bVar23;
                } while (uVar21 <= uVar16 && bVar23);
              }
              if ((bVar24 & 1) != 0) {
                bVar24 = (byte)local_d0;
                break;
              }
              pOVar20 = (pointer)(ulong)((int)local_c8 + 1);
              pOVar13 = (pointer)(((long)(pOVar1->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pOVar1->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555);
              bVar23 = (long)pOVar13 - (long)pOVar20 != 0;
              bVar24 = pOVar20 <= pOVar13 && bVar23;
            } while (pOVar20 <= pOVar13 && bVar23);
          }
          if ((bVar24 & 1) == 0) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            local_118._M_string_length = 0;
            local_118.field_2._M_local_buf[0] = '\0';
            iVar9 = tinyexr::DecodeChunk
                              (local_38 + (long)pOVar10,local_b8[(long)pOVar10],pOVar1,local_a0,
                               local_b0,&local_118);
            bVar23 = iVar9 == 0;
            if (((!bVar23) && (iVar18 = iVar9, local_f8 != (char **)0x0)) &&
               (local_118._M_string_length != 0)) {
              pcVar12 = strdup(local_118._M_dataplus._M_p);
              *local_f8 = pcVar12;
            }
            pOVar10 = local_e8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
              pOVar10 = local_e8;
            }
          }
          else {
            bVar23 = false;
          }
          if (!bVar23) goto LAB_0010bf6b;
          pOVar10 = (OffsetData *)
                    ((long)&(pOVar10->offsets).
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
        } while (pOVar10 != local_d8);
      }
      iVar18 = 0;
    }
LAB_0010bf6b:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&local_98);
  }
  return iVar18;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        if (!tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i])) {
          tinyexr::SetErrorMessage("Invalid tile info.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}